

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O3

void __thiscall
afsm::test::TranFSM_RealEventSequence_Test::TestBody(TranFSM_RealEventSequence_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  connection_fsm fsm;
  connect local_2d9;
  Message local_2d8;
  AssertHelper local_2d0;
  internal local_2c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  local_2b8;
  
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine(&local_2b8);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::make_observer<char_const(&)[19]>
            (&local_2b8.super_observer_wrapper<afsm::test::test_fsm_observer>,
             (char (*) [19])"connection_fsm_def");
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::connect>(&local_2b8,&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process","fsm.process_event(events::connect{})",
             (event_process_result *)&local_2d8,(event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::complete>(&local_2b8,(complete *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process","fsm.process_event(events::complete{})",
             (event_process_result *)&local_2d8,(event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::ready_for_query>
                 (&local_2b8,(ready_for_query *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::begin>(&local_2b8,(begin *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process","fsm.process_event(events::begin{})",
             (event_process_result *)&local_2d8,(event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 1;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::execute>(&local_2b8,(execute *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::defer","fsm.process_event(events::execute{})",
             (event_process_result *)&local_2d8,(event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 1;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::commit>(&local_2b8,(commit *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::defer","fsm.process_event(events::commit{})",
             (event_process_result *)&local_2d8,(event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 2;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::command_complete>
                 (&local_2b8,(command_complete *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process_in_state",
             "fsm.process_event(events::command_complete{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::ready_for_query>
                 (&local_2b8,(ready_for_query *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::row_description>
                 (&local_2b8,(row_description *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process",
             "fsm.process_event(events::row_description{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 2;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::row_event>(&local_2b8,(row_event *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process_in_state",
             "fsm.process_event(events::row_event{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 2;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::row_event>(&local_2b8,(row_event *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process_in_state",
             "fsm.process_event(events::row_event{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,499,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::command_complete>
                 (&local_2b8,(command_complete *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process",
             "fsm.process_event(events::command_complete{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,500,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::ready_for_query>
                 (&local_2b8,(ready_for_query *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d8.ss_.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::ready_for_query>
                 (&local_2b8,(ready_for_query *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            (local_2c8,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d8);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if (CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2d8.ss_.ptr_._4_4_,local_2d8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8.
  super_state_machine_base<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  .super_type.
  super_state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  .super_state_base<afsm::test::connection_fsm_def>.super_type.super_connection_fsm_def.
  super_state_machine<connection_fsm_def,_def::tags::common_base<state_name>_>.
  super_state_def<afsm::test::connection_fsm_def,_afsm::def::tags::common_base<afsm::test::state_name>_>
  .super_common_base<afsm::test::state_name>.super_state_name._vptr_state_name =
       (type)&PTR__state_machine_0043aff0;
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_2b8.deferred_event_ids_._M_t);
  std::__cxx11::
  _List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::_M_clear(&local_2b8.deferred_events_.
              super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            );
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::~deque(&local_2b8.queued_events_);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_2b8.deferred_._M_t);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_2b8.handled_._M_t);
  if (local_2b8.super_observer_wrapper<afsm::test::test_fsm_observer>.observer_.
      super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.super_observer_wrapper<afsm::test::test_fsm_observer>.observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(TranFSM, RealEventSequence)
{
    using actions::event_process_result;
    using ::psst::ansi_color;
    connection_fsm fsm;
    fsm.make_observer("connection_fsm_def");

    // Enqueueing commands
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::connect{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::complete{}));
    // Connect response
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    // Enqueueing commands
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::begin{}));
    EXPECT_EQ(event_process_result::defer, fsm.process_event(events::execute{}));
    EXPECT_EQ(event_process_result::defer, fsm.process_event(events::commit{}));

    // Server responses
    // Begin
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // Simple query responses
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::row_description{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // Commit response
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
}